

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O3

void __thiscall google::protobuf::compiler::Version::Version(Version *this,Version *from)

{
  void *pvVar1;
  string *initial_value;
  int32 iVar2;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite = (_func_int **)&PTR__Version_00420dd0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  (this->suffix_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  if ((((from->_has_bits_).has_bits_[0] & 1) != 0) &&
     (initial_value = (from->suffix_).ptr_,
     initial_value != (string *)&internal::fixed_address_empty_string_abi_cxx11_)) {
    internal::ArenaStringPtr::CreateInstanceNoArena(&this->suffix_,initial_value);
  }
  this->patch_ = from->patch_;
  iVar2 = from->minor_;
  this->major_ = from->major_;
  this->minor_ = iVar2;
  return;
}

Assistant:

Version::Version(const Version& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  suffix_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_suffix()) {
    suffix_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.suffix_);
  }
  ::memcpy(&major_, &from.major_,
    reinterpret_cast<char*>(&patch_) -
    reinterpret_cast<char*>(&major_) + sizeof(patch_));
  // @@protoc_insertion_point(copy_constructor:google.protobuf.compiler.Version)
}